

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O3

int __thiscall zmq::dish_t::xxrecv(dish_t *this,msg_t *msg_)

{
  ssize_t sVar1;
  char *__s;
  const_iterator cVar2;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_R8D;
  allocator<char> local_51;
  key_type local_50;
  
  do {
    sVar1 = fq_t::recv(&this->_fq,(int)msg_,in_RDX,in_RCX,in_R8D);
    if ((int)sVar1 != 0) {
      return -1;
    }
    __s = msg_t::group(msg_);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->_subscriptions)._M_t,&local_50);
    in_RDX = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      in_RDX = extraout_RDX_00;
    }
  } while ((_Rb_tree_header *)cVar2._M_node ==
           &(this->_subscriptions)._M_t._M_impl.super__Rb_tree_header);
  return 0;
}

Assistant:

int zmq::dish_t::xxrecv (msg_t *msg_)
{
    do {
        //  Get a message using fair queueing algorithm.
        const int rc = _fq.recv (msg_);

        //  If there's no message available, return immediately.
        //  The same when error occurs.
        if (rc != 0)
            return -1;

        //  Skip non matching messages
    } while (0 == _subscriptions.count (std::string (msg_->group ())));

    //  Found a matching message
    return 0;
}